

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O0

bool crnlib::image_utils::read_from_file(image_u8 *dest,char *pFilename,uint read_flags)

{
  uint uVar1;
  undefined1 local_88 [8];
  data_stream_serializer serializer;
  undefined1 local_68 [8];
  cfile_stream file_stream;
  uint read_flags_local;
  char *pFilename_local;
  image_u8 *dest_local;
  
  if (read_flags < 2) {
    file_stream._60_4_ = read_flags;
    cfile_stream::cfile_stream((cfile_stream *)local_68);
    uVar1 = cfile_stream::open((cfile_stream *)local_68,pFilename,5,0);
    if ((uVar1 & 1) == 0) {
      dest_local._7_1_ = false;
    }
    else {
      data_stream_serializer::data_stream_serializer
                ((data_stream_serializer *)local_88,(data_stream *)local_68);
      dest_local._7_1_ =
           read_from_stream(dest,(data_stream_serializer *)local_88,file_stream._60_4_);
    }
    serializer.m_little_endian = true;
    serializer._9_3_ = 0;
    cfile_stream::~cfile_stream((cfile_stream *)local_68);
  }
  else {
    dest_local._7_1_ = false;
  }
  return dest_local._7_1_;
}

Assistant:

bool read_from_file(image_u8& dest, const char* pFilename, uint read_flags)
        {
            if (read_flags > cReadFlagsAllFlags)
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            cfile_stream file_stream;
            if (!file_stream.open(pFilename))
            {
                return false;
            }

            data_stream_serializer serializer(file_stream);
            return read_from_stream(dest, serializer, read_flags);
        }